

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O0

void sm3_process(sm3_context *ctx,uint8_t *data)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int local_370;
  int j;
  uint32_t Temp5;
  uint32_t Temp4;
  uint32_t Temp3;
  uint32_t Temp2;
  uint32_t Temp1;
  uint32_t T [64];
  uint32_t H;
  uint32_t G;
  uint32_t F;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t W1 [64];
  uint32_t W [68];
  uint32_t TT2;
  uint32_t TT1;
  uint32_t SS2;
  uint32_t SS1;
  uint8_t *data_local;
  sm3_context *ctx_local;
  
  for (local_370 = 0; local_370 < 0x10; local_370 = local_370 + 1) {
    (&Temp2)[local_370] = 0x79cc4519;
  }
  for (local_370 = 0x10; local_370 < 0x40; local_370 = local_370 + 1) {
    (&Temp2)[local_370] = 0x7a879d8a;
  }
  W1[0x3e] = (uint)*data << 0x18 | (uint)data[1] << 0x10 | (uint)data[2] << 8 | (uint)data[3];
  W1[0x3f] = (uint)data[4] << 0x18 | (uint)data[5] << 0x10 | (uint)data[6] << 8 | (uint)data[7];
  for (local_370 = 0x10; local_370 < 0x44; local_370 = local_370 + 1) {
    uVar2 = W1[(long)(local_370 + -0x10) + 0x3e] ^ W1[(long)(local_370 + -9) + 0x3e] ^
            (W1[(long)(local_370 + -3) + 0x3e] << 0xf | W1[(long)(local_370 + -3) + 0x3e] >> 0x11);
    W1[(long)local_370 + 0x3e] =
         uVar2 ^ (uVar2 << 0xf | uVar2 >> 0x11) ^ (uVar2 << 0x17 | uVar2 >> 9) ^
         (W1[(long)(local_370 + -0xd) + 0x3e] << 7 | W1[(long)(local_370 + -0xd) + 0x3e] >> 0x19) ^
         W1[(long)(local_370 + -6) + 0x3e];
  }
  for (local_370 = 0; local_370 < 0x40; local_370 = local_370 + 1) {
    (&B)[local_370] = W1[(long)local_370 + 0x3e] ^ W1[(long)(local_370 + 4) + 0x3e];
  }
  D = ctx->state[1];
  E = ctx->state[2];
  F = ctx->state[3];
  G = ctx->state[4];
  H = ctx->state[5];
  T[0x3f] = ctx->state[6];
  T[0x3e] = ctx->state[7];
  C = ctx->state[0];
  for (local_370 = 0; local_370 < 0x10; local_370 = local_370 + 1) {
    bVar1 = (byte)local_370;
    uVar2 = ((C << 0xc | C >> 0x14) + G +
            ((&Temp2)[local_370] << (bVar1 & 0x1f) |
            (&Temp2)[local_370] >> (0x20 - (bVar1 & 0x1f) & 0x1f))) * 0x80 |
            (C << 0xc | C >> 0x14) + G +
            ((&Temp2)[local_370] << (bVar1 & 0x1f) |
            (&Temp2)[local_370] >> (0x20 - (bVar1 & 0x1f) & 0x1f)) >> 0x19;
    iVar3 = (C ^ D ^ E) + F;
    lVar5 = (long)local_370;
    uVar4 = (G ^ H ^ T[0x3f]) + T[0x3e] + uVar2 + W1[(long)local_370 + 0x3e];
    F = E;
    E = D << 9 | D >> 0x17;
    D = C;
    T[0x3e] = T[0x3f];
    T[0x3f] = H << 0x13 | H >> 0xd;
    H = G;
    G = uVar4 ^ (uVar4 * 0x200 | uVar4 >> 0x17) ^ (uVar4 * 0x20000 | uVar4 >> 0xf);
    C = iVar3 + (uVar2 ^ (C << 0xc | C >> 0x14)) + (&B)[lVar5];
  }
  for (local_370 = 0x10; local_370 < 0x40; local_370 = local_370 + 1) {
    bVar1 = (byte)local_370;
    uVar2 = ((C << 0xc | C >> 0x14) + G +
            ((&Temp2)[local_370] << (bVar1 & 0x1f) |
            (&Temp2)[local_370] >> (0x20 - (bVar1 & 0x1f) & 0x1f))) * 0x80 |
            (C << 0xc | C >> 0x14) + G +
            ((&Temp2)[local_370] << (bVar1 & 0x1f) |
            (&Temp2)[local_370] >> (0x20 - (bVar1 & 0x1f) & 0x1f)) >> 0x19;
    iVar3 = (C & (D | E) | D & E) + F;
    lVar5 = (long)local_370;
    uVar4 = (G & H | (G ^ 0xffffffff) & T[0x3f]) + T[0x3e] + uVar2 + W1[(long)local_370 + 0x3e];
    F = E;
    E = D << 9 | D >> 0x17;
    D = C;
    T[0x3e] = T[0x3f];
    T[0x3f] = H << 0x13 | H >> 0xd;
    H = G;
    G = uVar4 ^ (uVar4 * 0x200 | uVar4 >> 0x17) ^ (uVar4 * 0x20000 | uVar4 >> 0xf);
    C = iVar3 + (uVar2 ^ (C << 0xc | C >> 0x14)) + (&B)[lVar5];
  }
  ctx->state[0] = C ^ ctx->state[0];
  ctx->state[1] = D ^ ctx->state[1];
  ctx->state[2] = E ^ ctx->state[2];
  ctx->state[3] = F ^ ctx->state[3];
  ctx->state[4] = G ^ ctx->state[4];
  ctx->state[5] = H ^ ctx->state[5];
  ctx->state[6] = T[0x3f] ^ ctx->state[6];
  ctx->state[7] = T[0x3e] ^ ctx->state[7];
  return;
}

Assistant:

static void sm3_process(struct sm3_context *ctx, const uint8_t data[64])
{
	uint32_t SS1, SS2, TT1, TT2, W[68], W1[64];
	uint32_t A, B, C, D, E, F, G, H;
	uint32_t T[64];
	uint32_t Temp1, Temp2, Temp3, Temp4, Temp5;
	int j;

	for (j = 0; j < 16; j++)
		T[j] = 0x79CC4519;
	for (j = 16; j < 64; j++)
		T[j] = 0x7A879D8A;

	GET_UINT32_BE(W[0], data,  0);
	GET_UINT32_BE(W[1], data,  4);
	GET_UINT32_BE(W[2], data,  8);
	GET_UINT32_BE(W[3], data, 12);
	GET_UINT32_BE(W[4], data, 16);
	GET_UINT32_BE(W[5], data, 20);
	GET_UINT32_BE(W[6], data, 24);
	GET_UINT32_BE(W[7], data, 28);
	GET_UINT32_BE(W[8], data, 32);
	GET_UINT32_BE(W[9], data, 36);
	GET_UINT32_BE(W[10], data, 40);
	GET_UINT32_BE(W[11], data, 44);
	GET_UINT32_BE(W[12], data, 48);
	GET_UINT32_BE(W[13], data, 52);
	GET_UINT32_BE(W[14], data, 56);
	GET_UINT32_BE(W[15], data, 60);

#define FF0(x, y, z)	((x) ^ (y) ^ (z))
#define FF1(x, y, z)	(((x) & (y)) | ((x) & (z)) | ((y) & (z)))

#define GG0(x, y, z)	((x) ^ (y) ^ (z))
#define GG1(x, y, z)	(((x) & (y)) | ((~(x)) & (z)))

#define SHL(x, n)	((x) << (n))
#define ROTL(x, y) ( (((uint32_t)(x)<<(uint32_t)((y)&31)) | (((uint32_t)(x)&0xFFFFFFFFUL)>>(uint32_t)((32-((y)&31))&31))) & 0xFFFFFFFFUL)

#define P0(x)	((x) ^ ROTL((x), 9) ^ ROTL((x), 17))
#define P1(x)	((x) ^ ROTL((x), 15) ^ ROTL((x), 23))

	for (j = 16; j < 68; j++) {
		/*
		 * W[j] = P1( W[j-16] ^ W[j-9] ^ ROTL(W[j-3],15)) ^
		 *        ROTL(W[j - 13],7 ) ^ W[j-6];
		 */

		Temp1 = W[j - 16] ^ W[j - 9];
		Temp2 = ROTL(W[j - 3], 15);
		Temp3 = Temp1 ^ Temp2;
		Temp4 = P1(Temp3);
		Temp5 =  ROTL(W[j - 13], 7) ^ W[j - 6];
		W[j] = Temp4 ^ Temp5;
	}

	for (j =  0; j < 64; j++)
		W1[j] = W[j] ^ W[j + 4];

	A = ctx->state[0];
	B = ctx->state[1];
	C = ctx->state[2];
	D = ctx->state[3];
	E = ctx->state[4];
	F = ctx->state[5];
	G = ctx->state[6];
	H = ctx->state[7];

	for (j = 0; j < 16; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF0(A, B, C) + D + SS2 + W1[j];
		TT2 = GG0(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	for (j = 16; j < 64; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF1(A, B, C) + D + SS2 + W1[j];
		TT2 = GG1(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	ctx->state[0] ^= A;
	ctx->state[1] ^= B;
	ctx->state[2] ^= C;
	ctx->state[3] ^= D;
	ctx->state[4] ^= E;
	ctx->state[5] ^= F;
	ctx->state[6] ^= G;
	ctx->state[7] ^= H;
}